

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::CamelToSnake(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  undefined8 local_28;
  size_t i;
  string *input_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 0;
  do {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= local_28) {
      return __return_storage_ptr__;
    }
    if (local_28 == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      cVar1 = CharToLower(*pcVar4);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
      if (*pcVar4 == '_') {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
        iVar2 = islower((int)*pcVar4);
        if (iVar2 == 0) {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
          iVar2 = islower((int)*pcVar4);
          if (iVar2 == 0) {
            pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
            iVar2 = isdigit((int)*pcVar4);
            if (iVar2 != 0) {
              pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
              iVar2 = isdigit((int)*pcVar4);
              if (iVar2 == 0) goto LAB_001b3c9c;
            }
          }
          else {
LAB_001b3c9c:
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'_');
          }
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
          cVar1 = CharToLower(*pcVar4);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar1);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar4);
        }
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::string CamelToSnake(const std::string &input) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) {
    if (i == 0) {
      s += CharToLower(input[i]);
    } else if (input[i] == '_') {
      s += '_';
    } else if (!islower(input[i])) {
      // Prevent duplicate underscores for Upper_Snake_Case strings
      // and UPPERCASE strings.
      if (islower(input[i - 1]) ||
          (isdigit(input[i - 1]) && !isdigit(input[i]))) {
        s += '_';
      }
      s += CharToLower(input[i]);
    } else {
      s += input[i];
    }
  }
  return s;
}